

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

void __thiscall textureT::textureT(textureT *this)

{
  textureT *this_local;
  
  std::__cxx11::string::string((string *)&this->Hash);
  std::__cxx11::string::string((string *)&this->filename);
  nite::Color::Color(&this->transparency);
  std::vector<nite::Texture_*,_std::allocator<nite::Texture_*>_>::vector(&this->owners);
  std::__cxx11::string::operator=((string *)&this->Hash,"NULL");
  std::__cxx11::string::operator=((string *)&this->filename,"NULL");
  this->texture = 0;
  this->empty = true;
  this->stick = false;
  return;
}

Assistant:

textureT(){
    	Hash = "NULL";
    	filename = "NULL";
		texture = 0;
		empty = 1;
		stick = false;
	}